

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::File> __thiscall kj::Directory::openFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar1;
  ulong in_R8;
  Own<const_kj::File> OVar2;
  Fault f_1;
  File *local_50;
  OwnOwn<const_kj::File> f;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x68))(&f_1);
  f.value.disposer = (Disposer *)f_1.exception;
  f.value.ptr = local_50;
  Own<const_kj::File>::dispose((Own<const_kj::File> *)&f_1);
  if (local_50 == (File *)0x0) {
    if ((in_R8 & 1) == 0) {
      if ((in_R8 & 2) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x246,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                   &path_local);
        _::Debug::Fault::~Fault(&f_1);
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x244,FAILED,(char *)0x0,"\"file does not exist\", path",
                   (char (*) [20])"file does not exist",&path_local);
        _::Debug::Fault::~Fault(&f_1);
      }
    }
    else if ((in_R8 & 2) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x242,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",&path_local);
      _::Debug::Fault::~Fault(&f_1);
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x249,FAILED,(char *)0x0,
                 "\"tryOpenFile() returned null despite no preconditions\", path",
                 (char (*) [53])"tryOpenFile() returned null despite no preconditions",&path_local);
      _::Debug::Fault::~Fault(&f_1);
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f_1.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_50;
    f.value.ptr = (File *)0x0;
  }
  Own<const_kj::File>::dispose(&f.value);
  pFVar1 = extraout_RDX;
  if (local_50 == (File *)0x0) {
    clock = nullClock();
    newInMemoryFile((kj *)&f,clock);
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.value.disposer;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)f.value.ptr;
    f.value.ptr = (File *)0x0;
    Own<kj::File>::dispose((Own<kj::File> *)&f);
    pFVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pFVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const File> Directory::openFile(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryOpenFile(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenFile() returned null despite no preconditions", path) { break; }